

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopenglfunctions.cpp
# Opt level: O2

int qt_gl_resolve_extensions(void)

{
  long lVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  QOpenGLContext *this;
  QOpenGLFunctions *pQVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  long in_FS_OFFSET;
  pair<int,_int> local_80;
  QArrayDataPointer<char> local_78;
  GLboolean srgbCapableFramebuffers;
  QSurfaceFormat format;
  QOpenGLExtensionMatcher extensionMatcher;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  extensionMatcher.m_extensions.q_hash.d = (QSet<QByteArray>)&DAT_aaaaaaaaaaaaaaaa;
  QOpenGLExtensionMatcher::QOpenGLExtensionMatcher(&extensionMatcher);
  this = QOpenGLContext::currentContext();
  format.d = (QSurfaceFormatPrivate *)&DAT_aaaaaaaaaaaaaaaa;
  QOpenGLContext::format((QOpenGLContext *)&format);
  QByteArray::QByteArray((QByteArray *)&srgbCapableFramebuffers,"GL_EXT_bgra",-1);
  bVar2 = QHash<QByteArray,_QHashDummyValue>::contains
                    ((QHash<QByteArray,_QHashDummyValue> *)&extensionMatcher,
                     (QByteArray *)&srgbCapableFramebuffers);
  QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&srgbCapableFramebuffers);
  QByteArray::QByteArray((QByteArray *)&srgbCapableFramebuffers,"GL_ARB_texture_rectangle",-1);
  bVar3 = QHash<QByteArray,_QHashDummyValue>::contains
                    ((QHash<QByteArray,_QHashDummyValue> *)&extensionMatcher,
                     (QByteArray *)&srgbCapableFramebuffers);
  QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&srgbCapableFramebuffers);
  QByteArray::QByteArray((QByteArray *)&srgbCapableFramebuffers,"GL_ARB_texture_compression",-1);
  bVar4 = QHash<QByteArray,_QHashDummyValue>::contains
                    ((QHash<QByteArray,_QHashDummyValue> *)&extensionMatcher,
                     (QByteArray *)&srgbCapableFramebuffers);
  QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&srgbCapableFramebuffers);
  uVar8 = (uint)bVar2 * 0x800 + (uint)bVar3 + 4;
  if (!bVar4) {
    uVar8 = (uint)bVar2 * 0x800 + (uint)bVar3;
  }
  QByteArray::QByteArray
            ((QByteArray *)&srgbCapableFramebuffers,"GL_EXT_texture_compression_s3tc",-1);
  bVar2 = QHash<QByteArray,_QHashDummyValue>::contains
                    ((QHash<QByteArray,_QHashDummyValue> *)&extensionMatcher,
                     (QByteArray *)&srgbCapableFramebuffers);
  QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&srgbCapableFramebuffers);
  uVar7 = uVar8 + 0x1000;
  if (!bVar2) {
    uVar7 = uVar8;
  }
  QByteArray::QByteArray
            ((QByteArray *)&srgbCapableFramebuffers,"GL_OES_compressed_ETC1_RGB8_texture",-1);
  bVar2 = QHash<QByteArray,_QHashDummyValue>::contains
                    ((QHash<QByteArray,_QHashDummyValue> *)&extensionMatcher,
                     (QByteArray *)&srgbCapableFramebuffers);
  QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&srgbCapableFramebuffers);
  uVar8 = uVar7 | 0x2000;
  if (!bVar2) {
    uVar8 = uVar7;
  }
  QByteArray::QByteArray
            ((QByteArray *)&srgbCapableFramebuffers,"GL_IMG_texture_compression_pvrtc",-1);
  bVar2 = QHash<QByteArray,_QHashDummyValue>::contains
                    ((QHash<QByteArray,_QHashDummyValue> *)&extensionMatcher,
                     (QByteArray *)&srgbCapableFramebuffers);
  QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&srgbCapableFramebuffers);
  uVar7 = uVar8 | 0x4000;
  if (!bVar2) {
    uVar7 = uVar8;
  }
  QByteArray::QByteArray
            ((QByteArray *)&srgbCapableFramebuffers,"GL_KHR_texture_compression_astc_ldr",-1);
  bVar2 = QHash<QByteArray,_QHashDummyValue>::contains
                    ((QHash<QByteArray,_QHashDummyValue> *)&extensionMatcher,
                     (QByteArray *)&srgbCapableFramebuffers);
  QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&srgbCapableFramebuffers);
  uVar8 = uVar7 | 0x4000000;
  if (!bVar2) {
    uVar8 = uVar7;
  }
  QByteArray::QByteArray((QByteArray *)&srgbCapableFramebuffers,"GL_ARB_texture_mirrored_repeat",-1)
  ;
  bVar2 = QHash<QByteArray,_QHashDummyValue>::contains
                    ((QHash<QByteArray,_QHashDummyValue> *)&extensionMatcher,
                     (QByteArray *)&srgbCapableFramebuffers);
  QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&srgbCapableFramebuffers);
  uVar7 = uVar8 | 8;
  if (!bVar2) {
    uVar7 = uVar8;
  }
  QByteArray::QByteArray((QByteArray *)&srgbCapableFramebuffers,"GL_EXT_stencil_two_side",-1);
  bVar2 = QHash<QByteArray,_QHashDummyValue>::contains
                    ((QHash<QByteArray,_QHashDummyValue> *)&extensionMatcher,
                     (QByteArray *)&srgbCapableFramebuffers);
  QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&srgbCapableFramebuffers);
  uVar8 = uVar7 | 0x20;
  if (!bVar2) {
    uVar8 = uVar7;
  }
  QByteArray::QByteArray((QByteArray *)&srgbCapableFramebuffers,"GL_EXT_stencil_wrap",-1);
  bVar2 = QHash<QByteArray,_QHashDummyValue>::contains
                    ((QHash<QByteArray,_QHashDummyValue> *)&extensionMatcher,
                     (QByteArray *)&srgbCapableFramebuffers);
  QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&srgbCapableFramebuffers);
  uVar7 = uVar8 | 0x40;
  if (!bVar2) {
    uVar7 = uVar8;
  }
  QByteArray::QByteArray((QByteArray *)&srgbCapableFramebuffers,"GL_NV_float_buffer",-1);
  bVar2 = QHash<QByteArray,_QHashDummyValue>::contains
                    ((QHash<QByteArray,_QHashDummyValue> *)&extensionMatcher,
                     (QByteArray *)&srgbCapableFramebuffers);
  QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&srgbCapableFramebuffers);
  uVar8 = uVar7 | 0x100;
  if (!bVar2) {
    uVar8 = uVar7;
  }
  QByteArray::QByteArray((QByteArray *)&srgbCapableFramebuffers,"GL_ARB_pixel_buffer_object",-1);
  bVar2 = QHash<QByteArray,_QHashDummyValue>::contains
                    ((QHash<QByteArray,_QHashDummyValue> *)&extensionMatcher,
                     (QByteArray *)&srgbCapableFramebuffers);
  QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&srgbCapableFramebuffers);
  uVar7 = uVar8 | 0x200;
  if (!bVar2) {
    uVar7 = uVar8;
  }
  QByteArray::QByteArray((QByteArray *)&srgbCapableFramebuffers,"GL_ARB_texture_swizzle",-1);
  bVar2 = QHash<QByteArray,_QHashDummyValue>::contains
                    ((QHash<QByteArray,_QHashDummyValue> *)&extensionMatcher,
                     (QByteArray *)&srgbCapableFramebuffers);
  bVar3 = true;
  if (!bVar2) {
    QByteArray::QByteArray((QByteArray *)&local_78,"GL_EXT_texture_swizzle",-1);
    bVar3 = QHash<QByteArray,_QHashDummyValue>::contains
                      ((QHash<QByteArray,_QHashDummyValue> *)&extensionMatcher,
                       (QByteArray *)&local_78);
    QArrayDataPointer<char>::~QArrayDataPointer(&local_78);
  }
  QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&srgbCapableFramebuffers);
  uVar8 = uVar7 | 0x1000000;
  if (bVar3 == false) {
    uVar8 = uVar7;
  }
  QByteArray::QByteArray((QByteArray *)&srgbCapableFramebuffers,"GL_OES_standard_derivatives",-1);
  bVar2 = QHash<QByteArray,_QHashDummyValue>::contains
                    ((QHash<QByteArray,_QHashDummyValue> *)&extensionMatcher,
                     (QByteArray *)&srgbCapableFramebuffers);
  QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&srgbCapableFramebuffers);
  uVar7 = uVar8 | 0x2000000;
  if (!bVar2) {
    uVar7 = uVar8;
  }
  QByteArray::QByteArray((QByteArray *)&srgbCapableFramebuffers,"GL_ARB_half_float_vertex",-1);
  bVar2 = QHash<QByteArray,_QHashDummyValue>::contains
                    ((QHash<QByteArray,_QHashDummyValue> *)&extensionMatcher,
                     (QByteArray *)&srgbCapableFramebuffers);
  QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&srgbCapableFramebuffers);
  uVar8 = uVar7 | 0x10000000;
  if (!bVar2) {
    uVar8 = uVar7;
  }
  QByteArray::QByteArray((QByteArray *)&srgbCapableFramebuffers,"GL_OVR_multiview",-1);
  bVar2 = QHash<QByteArray,_QHashDummyValue>::contains
                    ((QHash<QByteArray,_QHashDummyValue> *)&extensionMatcher,
                     (QByteArray *)&srgbCapableFramebuffers);
  QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&srgbCapableFramebuffers);
  uVar7 = uVar8 | 0x20000000;
  if (!bVar2) {
    uVar7 = uVar8;
  }
  QByteArray::QByteArray((QByteArray *)&srgbCapableFramebuffers,"GL_OVR_multiview2",-1);
  bVar2 = QHash<QByteArray,_QHashDummyValue>::contains
                    ((QHash<QByteArray,_QHashDummyValue> *)&extensionMatcher,
                     (QByteArray *)&srgbCapableFramebuffers);
  QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&srgbCapableFramebuffers);
  uVar8 = uVar7 | 0x40000000;
  if (!bVar2) {
    uVar8 = uVar7;
  }
  bVar2 = QOpenGLContext::isOpenGLES(this);
  if (bVar2) {
    iVar5 = QSurfaceFormat::majorVersion(&format);
    uVar7 = uVar8 | 2;
    if (iVar5 < 2) {
      uVar7 = uVar8;
    }
    iVar5 = QSurfaceFormat::majorVersion(&format);
    if (iVar5 < 3) {
      QByteArray::QByteArray
                ((QByteArray *)&srgbCapableFramebuffers,"GL_OES_packed_depth_stencil",-1);
      bVar2 = QHash<QByteArray,_QHashDummyValue>::contains
                        ((QHash<QByteArray,_QHashDummyValue> *)&extensionMatcher,
                         (QByteArray *)&srgbCapableFramebuffers);
      QArrayDataPointer<char>::~QArrayDataPointer
                ((QArrayDataPointer<char> *)&srgbCapableFramebuffers);
      uVar8 = uVar7 | 0x80;
      if (!bVar2) {
        uVar8 = uVar7;
      }
      QByteArray::QByteArray((QByteArray *)&srgbCapableFramebuffers,"GL_OES_depth24",-1);
      bVar2 = QHash<QByteArray,_QHashDummyValue>::contains
                        ((QHash<QByteArray,_QHashDummyValue> *)&extensionMatcher,
                         (QByteArray *)&srgbCapableFramebuffers);
      QArrayDataPointer<char>::~QArrayDataPointer
                ((QArrayDataPointer<char> *)&srgbCapableFramebuffers);
      uVar7 = uVar8 | 0x10000;
      if (!bVar2) {
        uVar7 = uVar8;
      }
      QByteArray::QByteArray((QByteArray *)&srgbCapableFramebuffers,"GL_ANGLE_framebuffer_blit",-1);
      bVar2 = QHash<QByteArray,_QHashDummyValue>::contains
                        ((QHash<QByteArray,_QHashDummyValue> *)&extensionMatcher,
                         (QByteArray *)&srgbCapableFramebuffers);
      QArrayDataPointer<char>::~QArrayDataPointer
                ((QArrayDataPointer<char> *)&srgbCapableFramebuffers);
      uVar8 = uVar7 | 0x400;
      if (!bVar2) {
        uVar8 = uVar7;
      }
      QByteArray::QByteArray
                ((QByteArray *)&srgbCapableFramebuffers,"GL_ANGLE_framebuffer_multisample",-1);
      bVar2 = QHash<QByteArray,_QHashDummyValue>::contains
                        ((QHash<QByteArray,_QHashDummyValue> *)&extensionMatcher,
                         (QByteArray *)&srgbCapableFramebuffers);
      QArrayDataPointer<char>::~QArrayDataPointer
                ((QArrayDataPointer<char> *)&srgbCapableFramebuffers);
      uVar7 = uVar8 | 0x10;
      if (!bVar2) {
        uVar7 = uVar8;
      }
      QByteArray::QByteArray((QByteArray *)&srgbCapableFramebuffers,"GL_NV_framebuffer_blit",-1);
      bVar2 = QHash<QByteArray,_QHashDummyValue>::contains
                        ((QHash<QByteArray,_QHashDummyValue> *)&extensionMatcher,
                         (QByteArray *)&srgbCapableFramebuffers);
      QArrayDataPointer<char>::~QArrayDataPointer
                ((QArrayDataPointer<char> *)&srgbCapableFramebuffers);
      uVar8 = uVar7 | 0x400;
      if (!bVar2) {
        uVar8 = uVar7;
      }
      QByteArray::QByteArray
                ((QByteArray *)&srgbCapableFramebuffers,"GL_NV_framebuffer_multisample",-1);
      bVar2 = QHash<QByteArray,_QHashDummyValue>::contains
                        ((QHash<QByteArray,_QHashDummyValue> *)&extensionMatcher,
                         (QByteArray *)&srgbCapableFramebuffers);
      QArrayDataPointer<char>::~QArrayDataPointer
                ((QArrayDataPointer<char> *)&srgbCapableFramebuffers);
      uVar7 = uVar8 | 0x10;
      if (!bVar2) {
        uVar7 = uVar8;
      }
      QByteArray::QByteArray((QByteArray *)&srgbCapableFramebuffers,"GL_OES_rgb8_rgba8",-1);
      bVar2 = QHash<QByteArray,_QHashDummyValue>::contains
                        ((QHash<QByteArray,_QHashDummyValue> *)&extensionMatcher,
                         (QByteArray *)&srgbCapableFramebuffers);
      QArrayDataPointer<char>::~QArrayDataPointer
                ((QArrayDataPointer<char> *)&srgbCapableFramebuffers);
      uVar8 = uVar7 | 0x200000;
      if (!bVar2) {
        uVar8 = uVar7;
      }
      QByteArray::QByteArray
                ((QByteArray *)&srgbCapableFramebuffers,"GL_OES_compressed_ETC2_RGB8_texture",-1);
      bVar2 = QHash<QByteArray,_QHashDummyValue>::contains
                        ((QHash<QByteArray,_QHashDummyValue> *)&extensionMatcher,
                         (QByteArray *)&srgbCapableFramebuffers);
      QArrayDataPointer<char>::~QArrayDataPointer
                ((QArrayDataPointer<char> *)&srgbCapableFramebuffers);
      uVar7 = uVar8 | 0x8000000;
      if (!bVar2) {
        uVar7 = uVar8;
      }
    }
    else {
      uVar7 = uVar7 | 0x1b718490;
    }
    QByteArray::QByteArray((QByteArray *)&srgbCapableFramebuffers,"GL_OES_mapbuffer",-1);
    bVar2 = QHash<QByteArray,_QHashDummyValue>::contains
                      ((QHash<QByteArray,_QHashDummyValue> *)&extensionMatcher,
                       (QByteArray *)&srgbCapableFramebuffers);
    QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&srgbCapableFramebuffers)
    ;
    uVar8 = uVar7 | 0x40000;
    if (!bVar2) {
      uVar8 = uVar7;
    }
    QByteArray::QByteArray((QByteArray *)&srgbCapableFramebuffers,"GL_OES_element_index_uint",-1);
    bVar2 = QHash<QByteArray,_QHashDummyValue>::contains
                      ((QHash<QByteArray,_QHashDummyValue> *)&extensionMatcher,
                       (QByteArray *)&srgbCapableFramebuffers);
    QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&srgbCapableFramebuffers)
    ;
    uVar7 = uVar8 | 0x8000;
    if (!bVar2) {
      uVar7 = uVar8;
    }
    QByteArray::QByteArray
              ((QByteArray *)&srgbCapableFramebuffers,"GL_IMG_texture_format_BGRA8888",-1);
    bVar2 = QHash<QByteArray,_QHashDummyValue>::contains
                      ((QHash<QByteArray,_QHashDummyValue> *)&extensionMatcher,
                       (QByteArray *)&srgbCapableFramebuffers);
    bVar3 = true;
    if (!bVar2) {
      QByteArray::QByteArray((QByteArray *)&local_78,"GL_EXT_texture_format_BGRA8888",-1);
      bVar3 = QHash<QByteArray,_QHashDummyValue>::contains
                        ((QHash<QByteArray,_QHashDummyValue> *)&extensionMatcher,
                         (QByteArray *)&local_78);
      QArrayDataPointer<char>::~QArrayDataPointer(&local_78);
    }
    QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&srgbCapableFramebuffers)
    ;
    uVar8 = uVar7 | 0x800;
    if (bVar3 == false) {
      uVar8 = uVar7;
    }
    QByteArray::QByteArray((QByteArray *)&srgbCapableFramebuffers,"GL_EXT_discard_framebuffer",-1);
    bVar2 = QHash<QByteArray,_QHashDummyValue>::contains
                      ((QHash<QByteArray,_QHashDummyValue> *)&extensionMatcher,
                       (QByteArray *)&srgbCapableFramebuffers);
    QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&srgbCapableFramebuffers)
    ;
    uVar7 = uVar8 | 0x400000;
    if (!bVar2) {
      uVar7 = uVar8;
    }
    QByteArray::QByteArray((QByteArray *)&srgbCapableFramebuffers,"GL_EXT_texture_norm16",-1);
    bVar2 = QHash<QByteArray,_QHashDummyValue>::contains
                      ((QHash<QByteArray,_QHashDummyValue> *)&extensionMatcher,
                       (QByteArray *)&srgbCapableFramebuffers);
    QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&srgbCapableFramebuffers)
    ;
    uVar8 = uVar7 | 0x800000;
    if (!bVar2) {
      uVar8 = uVar7;
    }
    goto LAB_004d8701;
  }
  _srgbCapableFramebuffers = QSurfaceFormat::version(&format);
  local_78.d = (Data *)0x200000001;
  bVar2 = std::operator>=((pair<int,_int> *)&srgbCapableFramebuffers,(pair<int,_int> *)&local_78);
  uVar8 = (uint)bVar2 << 0xb | uVar8;
  local_78.d = (Data *)QSurfaceFormat::version(&format);
  local_80.first = 1;
  local_80.second = 4;
  bVar2 = std::operator>=((pair<int,_int> *)&local_78,&local_80);
  if (bVar2) {
    uVar7 = uVar8 | 0x848002;
  }
  else {
    QByteArray::QByteArray((QByteArray *)&srgbCapableFramebuffers,"GL_SGIS_generate_mipmap",-1);
    bVar2 = QHash<QByteArray,_QHashDummyValue>::contains
                      ((QHash<QByteArray,_QHashDummyValue> *)&extensionMatcher,
                       (QByteArray *)&srgbCapableFramebuffers);
    QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&srgbCapableFramebuffers)
    ;
    uVar7 = uVar8 | 0x848000;
    if (bVar2) {
      uVar7 = uVar8 | 0x848002;
    }
  }
  iVar5 = QSurfaceFormat::majorVersion(&format);
  uVar8 = uVar7 | 0x2000000;
  if (iVar5 < 2) {
    uVar8 = uVar7;
  }
  iVar5 = QSurfaceFormat::majorVersion(&format);
  if (iVar5 < 3) {
    QByteArray::QByteArray((QByteArray *)&srgbCapableFramebuffers,"GL_ARB_framebuffer_object",-1);
    bVar2 = QHash<QByteArray,_QHashDummyValue>::contains
                      ((QHash<QByteArray,_QHashDummyValue> *)&extensionMatcher,
                       (QByteArray *)&srgbCapableFramebuffers);
    QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&srgbCapableFramebuffers)
    ;
    if (bVar2) goto LAB_004d8430;
    QByteArray::QByteArray
              ((QByteArray *)&srgbCapableFramebuffers,"GL_EXT_framebuffer_multisample",-1);
    bVar2 = QHash<QByteArray,_QHashDummyValue>::contains
                      ((QHash<QByteArray,_QHashDummyValue> *)&extensionMatcher,
                       (QByteArray *)&srgbCapableFramebuffers);
    QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&srgbCapableFramebuffers)
    ;
    uVar7 = uVar8 | 0x10;
    if (!bVar2) {
      uVar7 = uVar8;
    }
    QByteArray::QByteArray((QByteArray *)&srgbCapableFramebuffers,"GL_EXT_framebuffer_blit",-1);
    bVar2 = QHash<QByteArray,_QHashDummyValue>::contains
                      ((QHash<QByteArray,_QHashDummyValue> *)&extensionMatcher,
                       (QByteArray *)&srgbCapableFramebuffers);
    QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&srgbCapableFramebuffers)
    ;
    uVar9 = uVar7 | 0x400;
    if (!bVar2) {
      uVar9 = uVar7;
    }
    QByteArray::QByteArray((QByteArray *)&srgbCapableFramebuffers,"GL_EXT_packed_depth_stencil",-1);
    bVar2 = QHash<QByteArray,_QHashDummyValue>::contains
                      ((QHash<QByteArray,_QHashDummyValue> *)&extensionMatcher,
                       (QByteArray *)&srgbCapableFramebuffers);
    QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&srgbCapableFramebuffers)
    ;
    uVar8 = uVar9 | 0x80;
    if (!bVar2) {
      uVar8 = uVar9;
    }
  }
  else {
LAB_004d8430:
    uVar8 = uVar8 | 0x200490;
  }
  local_78.d = (Data *)QSurfaceFormat::version(&format);
  local_80.first = 3;
  local_80.second = 2;
  bVar2 = std::operator>=((pair<int,_int> *)&local_78,&local_80);
  if (bVar2) {
    uVar8 = uVar8 | 0x80000;
  }
  else {
    QByteArray::QByteArray((QByteArray *)&srgbCapableFramebuffers,"GL_ARB_geometry_shader4",-1);
    bVar2 = QHash<QByteArray,_QHashDummyValue>::contains
                      ((QHash<QByteArray,_QHashDummyValue> *)&extensionMatcher,
                       (QByteArray *)&srgbCapableFramebuffers);
    QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&srgbCapableFramebuffers)
    ;
    if (bVar2) {
      uVar8 = uVar8 | 0x80000;
    }
  }
  _srgbCapableFramebuffers = QSurfaceFormat::version(&format);
  local_78.d = (Data *)0x300000003;
  bVar2 = std::operator>=((pair<int,_int> *)&srgbCapableFramebuffers,(pair<int,_int> *)&local_78);
  uVar7 = uVar8 | 0x1000000;
  if (!bVar2) {
    uVar7 = uVar8;
  }
  local_78.d = (Data *)QSurfaceFormat::version(&format);
  local_80.first = 4;
  local_80.second = 3;
  bVar2 = std::operator>=((pair<int,_int> *)&local_78,&local_80);
  if (bVar2) {
    uVar7 = uVar7 | 0x400000;
  }
  else {
    QByteArray::QByteArray((QByteArray *)&srgbCapableFramebuffers,"GL_ARB_invalidate_subdata",-1);
    bVar2 = QHash<QByteArray,_QHashDummyValue>::contains
                      ((QHash<QByteArray,_QHashDummyValue> *)&extensionMatcher,
                       (QByteArray *)&srgbCapableFramebuffers);
    QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&srgbCapableFramebuffers)
    ;
    if (bVar2) {
      uVar7 = uVar7 | 0x400000;
    }
  }
  QByteArray::QByteArray((QByteArray *)&srgbCapableFramebuffers,"GL_ARB_map_buffer_range",-1);
  bVar2 = QHash<QByteArray,_QHashDummyValue>::contains
                    ((QHash<QByteArray,_QHashDummyValue> *)&extensionMatcher,
                     (QByteArray *)&srgbCapableFramebuffers);
  QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&srgbCapableFramebuffers);
  uVar9 = uVar7 | 0x100000;
  if (!bVar2) {
    uVar9 = uVar7;
  }
  QByteArray::QByteArray((QByteArray *)&srgbCapableFramebuffers,"GL_EXT_framebuffer_sRGB",-1);
  bVar2 = QHash<QByteArray,_QHashDummyValue>::contains
                    ((QHash<QByteArray,_QHashDummyValue> *)&extensionMatcher,
                     (QByteArray *)&srgbCapableFramebuffers);
  QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&srgbCapableFramebuffers);
  if (bVar2) {
    _srgbCapableFramebuffers =
         (pair<int,_int>)((ulong)_srgbCapableFramebuffers & 0xffffffffffffff00);
    pQVar6 = QOpenGLContext::functions(this);
    (*(pQVar6->d_ptr->field_0).functions[0x16])(0x8dba,&srgbCapableFramebuffers);
    if (srgbCapableFramebuffers != '\0') {
      uVar9 = uVar9 | 0x20000;
    }
  }
  QByteArray::QByteArray((QByteArray *)&srgbCapableFramebuffers,"GL_ARB_ES3_compatibility",-1);
  bVar2 = QHash<QByteArray,_QHashDummyValue>::contains
                    ((QHash<QByteArray,_QHashDummyValue> *)&extensionMatcher,
                     (QByteArray *)&srgbCapableFramebuffers);
  QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&srgbCapableFramebuffers);
  uVar8 = uVar9 | 0x8000000;
  if (!bVar2) {
    uVar8 = uVar9;
  }
LAB_004d8701:
  QSurfaceFormat::~QSurfaceFormat(&format);
  QHash<QByteArray,_QHashDummyValue>::~QHash
            ((QHash<QByteArray,_QHashDummyValue> *)&extensionMatcher);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return uVar8;
}

Assistant:

static int qt_gl_resolve_extensions()
{
    int extensions = 0;
    QOpenGLExtensionMatcher extensionMatcher;
    QOpenGLContext *ctx = QOpenGLContext::currentContext();
    QSurfaceFormat format = ctx->format();

    if (extensionMatcher.match("GL_EXT_bgra"))
        extensions |= QOpenGLExtensions::BGRATextureFormat;
    if (extensionMatcher.match("GL_ARB_texture_rectangle"))
        extensions |= QOpenGLExtensions::TextureRectangle;
    if (extensionMatcher.match("GL_ARB_texture_compression"))
        extensions |= QOpenGLExtensions::TextureCompression;
    if (extensionMatcher.match("GL_EXT_texture_compression_s3tc"))
        extensions |= QOpenGLExtensions::DDSTextureCompression;
    if (extensionMatcher.match("GL_OES_compressed_ETC1_RGB8_texture"))
        extensions |= QOpenGLExtensions::ETC1TextureCompression;
    if (extensionMatcher.match("GL_IMG_texture_compression_pvrtc"))
        extensions |= QOpenGLExtensions::PVRTCTextureCompression;
    if (extensionMatcher.match("GL_KHR_texture_compression_astc_ldr"))
        extensions |= QOpenGLExtensions::ASTCTextureCompression;
    if (extensionMatcher.match("GL_ARB_texture_mirrored_repeat"))
        extensions |= QOpenGLExtensions::MirroredRepeat;
    if (extensionMatcher.match("GL_EXT_stencil_two_side"))
        extensions |= QOpenGLExtensions::StencilTwoSide;
    if (extensionMatcher.match("GL_EXT_stencil_wrap"))
        extensions |= QOpenGLExtensions::StencilWrap;
    if (extensionMatcher.match("GL_NV_float_buffer"))
        extensions |= QOpenGLExtensions::NVFloatBuffer;
    if (extensionMatcher.match("GL_ARB_pixel_buffer_object"))
        extensions |= QOpenGLExtensions::PixelBufferObject;
    if (extensionMatcher.match("GL_ARB_texture_swizzle") || extensionMatcher.match("GL_EXT_texture_swizzle"))
        extensions |= QOpenGLExtensions::TextureSwizzle;
    if (extensionMatcher.match("GL_OES_standard_derivatives"))
        extensions |= QOpenGLExtensions::StandardDerivatives;
    if (extensionMatcher.match("GL_ARB_half_float_vertex"))
        extensions |= QOpenGLExtensions::HalfFloatVertex;
    if (extensionMatcher.match("GL_OVR_multiview"))
        extensions |= QOpenGLExtensions::MultiView;
    if (extensionMatcher.match("GL_OVR_multiview2"))
        extensions |= QOpenGLExtensions::MultiViewExtended;

    if (ctx->isOpenGLES()) {
        if (format.majorVersion() >= 2)
            extensions |= QOpenGLExtensions::GenerateMipmap;

        if (format.majorVersion() >= 3) {
            extensions |= QOpenGLExtensions::PackedDepthStencil
                | QOpenGLExtensions::Depth24
                | QOpenGLExtensions::ElementIndexUint
                | QOpenGLExtensions::MapBufferRange
                | QOpenGLExtensions::FramebufferBlit
                | QOpenGLExtensions::FramebufferMultisample
                | QOpenGLExtensions::Sized8Formats
                | QOpenGLExtensions::DiscardFramebuffer
                | QOpenGLExtensions::StandardDerivatives
                | QOpenGLExtensions::ETC2TextureCompression
                | QOpenGLExtensions::HalfFloatVertex;
#ifndef Q_OS_WASM
            // WebGL 2.0 specification explicitly does not support texture swizzles
            // https://registry.khronos.org/webgl/specs/latest/2.0/#5.19
            extensions |= QOpenGLExtensions::TextureSwizzle;
#endif
        } else {
            // Recognize features by extension name.
            if (extensionMatcher.match("GL_OES_packed_depth_stencil"))
                extensions |= QOpenGLExtensions::PackedDepthStencil;
            if (extensionMatcher.match("GL_OES_depth24"))
                extensions |= QOpenGLExtensions::Depth24;
            if (extensionMatcher.match("GL_ANGLE_framebuffer_blit"))
                extensions |= QOpenGLExtensions::FramebufferBlit;
            if (extensionMatcher.match("GL_ANGLE_framebuffer_multisample"))
                extensions |= QOpenGLExtensions::FramebufferMultisample;
            if (extensionMatcher.match("GL_NV_framebuffer_blit"))
                extensions |= QOpenGLExtensions::FramebufferBlit;
            if (extensionMatcher.match("GL_NV_framebuffer_multisample"))
                extensions |= QOpenGLExtensions::FramebufferMultisample;
            if (extensionMatcher.match("GL_OES_rgb8_rgba8"))
                extensions |= QOpenGLExtensions::Sized8Formats;
            if (extensionMatcher.match("GL_OES_compressed_ETC2_RGB8_texture"))
                extensions |= QOpenGLExtensions::ETC2TextureCompression;
        }

        if (extensionMatcher.match("GL_OES_mapbuffer"))
            extensions |= QOpenGLExtensions::MapBuffer;
        if (extensionMatcher.match("GL_OES_element_index_uint"))
            extensions |= QOpenGLExtensions::ElementIndexUint;
        // We don't match GL_APPLE_texture_format_BGRA8888 here because it has different semantics.
        if (extensionMatcher.match("GL_IMG_texture_format_BGRA8888") || extensionMatcher.match("GL_EXT_texture_format_BGRA8888"))
            extensions |= QOpenGLExtensions::BGRATextureFormat;
#ifdef Q_OS_ANDROID
        QString *deviceName =
                static_cast<QString *>(QGuiApplication::platformNativeInterface()->nativeResourceForIntegration("AndroidDeviceName"));
        static bool wrongfullyReportsBgra8888Support = deviceName != 0
                                                        && (deviceName->compare("samsung SM-T211"_L1, Qt::CaseInsensitive) == 0
                                                            || deviceName->compare("samsung SM-T210"_L1, Qt::CaseInsensitive) == 0
                                                            || deviceName->compare("samsung SM-T215"_L1, Qt::CaseInsensitive) == 0);
        if (wrongfullyReportsBgra8888Support)
            extensions &= ~QOpenGLExtensions::BGRATextureFormat;
#endif

        if (extensionMatcher.match("GL_EXT_discard_framebuffer"))
            extensions |= QOpenGLExtensions::DiscardFramebuffer;
        if (extensionMatcher.match("GL_EXT_texture_norm16"))
            extensions |= QOpenGLExtensions::Sized16Formats;
    } else {
        extensions |= QOpenGLExtensions::ElementIndexUint
            | QOpenGLExtensions::MapBuffer
            | QOpenGLExtensions::Sized16Formats;

        if (format.version() >= std::pair(1, 2))
            extensions |= QOpenGLExtensions::BGRATextureFormat;

        if (format.version() >= std::pair(1, 4) || extensionMatcher.match("GL_SGIS_generate_mipmap"))
            extensions |= QOpenGLExtensions::GenerateMipmap;

        if (format.majorVersion() >= 2)
            extensions |= QOpenGLExtensions::StandardDerivatives;

        if (format.majorVersion() >= 3 || extensionMatcher.match("GL_ARB_framebuffer_object")) {
            extensions |= QOpenGLExtensions::FramebufferMultisample
                | QOpenGLExtensions::FramebufferBlit
                | QOpenGLExtensions::PackedDepthStencil
                | QOpenGLExtensions::Sized8Formats;
        } else {
            // Recognize features by extension name.
            if (extensionMatcher.match("GL_EXT_framebuffer_multisample"))
                extensions |= QOpenGLExtensions::FramebufferMultisample;
            if (extensionMatcher.match("GL_EXT_framebuffer_blit"))
                extensions |= QOpenGLExtensions::FramebufferBlit;
            if (extensionMatcher.match("GL_EXT_packed_depth_stencil"))
                extensions |= QOpenGLExtensions::PackedDepthStencil;
        }

        if (format.version() >= std::pair(3, 2) || extensionMatcher.match("GL_ARB_geometry_shader4"))
            extensions |= QOpenGLExtensions::GeometryShaders;

        if (format.version() >= std::pair(3, 3))
            extensions |= QOpenGLExtensions::TextureSwizzle;

        if (format.version() >= std::pair(4, 3) || extensionMatcher.match("GL_ARB_invalidate_subdata"))
            extensions |= QOpenGLExtensions::DiscardFramebuffer;

        if (extensionMatcher.match("GL_ARB_map_buffer_range"))
            extensions |= QOpenGLExtensions::MapBufferRange;

        if (extensionMatcher.match("GL_EXT_framebuffer_sRGB")) {
            GLboolean srgbCapableFramebuffers = false;
            ctx->functions()->glGetBooleanv(GL_FRAMEBUFFER_SRGB_CAPABLE_EXT, &srgbCapableFramebuffers);
            if (srgbCapableFramebuffers)
                extensions |= QOpenGLExtensions::SRGBFrameBuffer;
        }

        if (extensionMatcher.match("GL_ARB_ES3_compatibility"))
            extensions |= QOpenGLExtensions::ETC2TextureCompression;
    }

    return extensions;
}